

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O1

void __thiscall MockNamedValueList::clear(MockNamedValueList *this)

{
  MockNamedValueListNode *pMVar1;
  MockNamedValue **ppMVar2;
  
  pMVar1 = this->head_;
  while (pMVar1 != (MockNamedValueListNode *)0x0) {
    ppMVar2 = &pMVar1->data_;
    pMVar1 = pMVar1->next_;
    if (*ppMVar2 != (MockNamedValue *)0x0) {
      (*(*ppMVar2)->_vptr_MockNamedValue[1])();
    }
    if (this->head_ != (MockNamedValueListNode *)0x0) {
      operator_delete(this->head_,0x10);
    }
    this->head_ = pMVar1;
  }
  return;
}

Assistant:

void MockNamedValueList::clear()
{
    while (head_) {
        MockNamedValueListNode* n = head_->next();
        head_->destroy();
        delete head_;
        head_ = n;
    }
}